

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSValue js_array_find(JSContext *ctx,JSValue this_val,int argc,JSValue *argv,int findIndex)

{
  JSValue JVar1;
  JSValue new_target;
  JSValue func_obj;
  int iVar2;
  JSValueUnion JVar3;
  ulong uVar4;
  JSValueUnion JVar6;
  uint uVar7;
  int64_t iVar8;
  JSRefCountHeader *p_1;
  JSValueUnion JVar9;
  uint uVar10;
  JSValue JVar11;
  JSValue v;
  JSValue JVar12;
  JSValue this_obj;
  JSRefCountHeader *p_3;
  int64_t len;
  ulong local_c0;
  int64_t local_b0;
  void *local_80;
  undefined4 local_78;
  uint uStack_74;
  undefined8 uStack_70;
  JSValue local_68;
  JSValueUnion local_58;
  int64_t local_50;
  JSValueUnion local_48;
  int64_t local_40;
  JSValueUnion JVar5;
  
  JVar11 = JS_ToObject(ctx,this_val);
  JVar3 = JVar11.u;
  iVar2 = js_get_length64(ctx,(int64_t *)&local_80,JVar11);
  uVar7 = (uint)JVar11.tag;
  if (iVar2 == 0) {
    func_obj = *argv;
    iVar2 = check_function(ctx,*argv);
    if (iVar2 == 0) {
      if (argc < 2) {
        local_b0 = 3;
        uVar4 = 0;
        local_c0 = 0;
      }
      else {
        local_b0 = argv[1].tag;
        local_c0 = (ulong)argv[1].u.ptr & 0xffffffff00000000;
        uVar4 = (ulong)argv[1].u.ptr & 0xffffffff;
      }
      if (0 < (long)local_80) {
        JVar9.float64 = 0.0;
        do {
          JVar6.float64 = (double)JVar9.float64;
          if (JVar9.ptr < (void *)0x80000000) {
            JVar6 = JVar9;
          }
          iVar8 = 7;
          if (JVar9.ptr < (void *)0x80000000) {
            iVar8 = 0;
          }
          JVar1.tag = iVar8;
          JVar1.u.float64 = JVar6.float64;
          JVar12.tag = iVar8;
          JVar12.u.float64 = JVar6.float64;
          v = JS_GetPropertyValue(ctx,JVar11,JVar12);
          JVar5 = v.u;
          uVar10 = (uint)v.tag;
          if (uVar10 == 6) {
LAB_00162527:
            if ((0xfffffff4 < uVar10) &&
               (iVar2 = *JVar5.ptr, *(int *)JVar5.ptr = iVar2 + -1, iVar2 < 2)) {
              __JS_FreeValueRT(ctx->rt,v);
            }
            goto LAB_001622f8;
          }
          local_78 = 0;
          uStack_70 = 3;
          new_target.tag = 3;
          new_target.u.ptr = (void *)((ulong)uStack_74 << 0x20);
          this_obj.tag = local_b0;
          this_obj.u.ptr = (void *)(local_c0 | uVar4);
          local_68 = v;
          local_58 = JVar6;
          local_50 = iVar8;
          local_48 = this_val.u;
          local_40 = this_val.tag;
          JVar12 = JS_CallInternal(ctx,func_obj,this_obj,new_target,3,&local_68,2);
          if ((int)JVar12.tag == 6) goto LAB_00162527;
          iVar2 = JS_ToBoolFree(ctx,JVar12);
          if (iVar2 != 0) {
            if (findIndex == 0) {
              if ((0xfffffff4 < uVar7) &&
                 (iVar2 = *JVar3.ptr, *(int *)JVar3.ptr = iVar2 + -1, iVar2 < 2)) {
                __JS_FreeValueRT(ctx->rt,JVar11);
              }
              JVar6.float64 = JVar5.float64 & 0xffffffff00000000;
            }
            else {
              if ((0xfffffff4 < uVar10) &&
                 (iVar2 = *JVar5.ptr, *(int *)JVar5.ptr = iVar2 + -1, iVar2 < 2)) {
                __JS_FreeValueRT(ctx->rt,v);
              }
              if ((0xfffffff4 < uVar7) &&
                 (iVar2 = *JVar3.ptr, *(int *)JVar3.ptr = iVar2 + -1, iVar2 < 2)) {
                __JS_FreeValueRT(ctx->rt,JVar11);
              }
              JVar6.float64 = JVar6.float64 & 0x7fffffff00000000;
              v = JVar1;
            }
            goto LAB_00162324;
          }
          if ((0xfffffff4 < uVar10) &&
             (iVar2 = *JVar5.ptr, *(int *)JVar5.ptr = iVar2 + -1, iVar2 < 2)) {
            __JS_FreeValueRT(ctx->rt,v);
          }
          JVar9.float64 = JVar9.float64 + 1;
        } while (local_80 != JVar9.ptr);
      }
      if ((0xfffffff4 < uVar7) && (iVar2 = *JVar3.ptr, *(int *)JVar3.ptr = iVar2 + -1, iVar2 < 2)) {
        __JS_FreeValueRT(ctx->rt,JVar11);
      }
      JVar6.float64 = 0.0;
      JVar3.float64 = 2.12199579047121e-314;
      if (findIndex == 0) {
        JVar3.float64 = JVar6.float64;
      }
      v.tag = (ulong)(findIndex == 0) * 3;
      v.u.float64 = JVar3.float64;
      goto LAB_00162324;
    }
  }
LAB_001622f8:
  if (0xfffffff4 < uVar7) {
    iVar2 = *JVar3.ptr;
    *(int *)JVar3.ptr = iVar2 + -1;
    if (iVar2 < 2) {
      __JS_FreeValueRT(ctx->rt,JVar11);
    }
  }
  JVar6.float64 = 0.0;
  v = (JSValue)(ZEXT816(6) << 0x40);
LAB_00162324:
  JVar11.u.float64 = (ulong)v.u.ptr & 0xffffffff | JVar6.float64;
  JVar11.tag = v.tag;
  return JVar11;
}

Assistant:

static JSValue js_array_find(JSContext *ctx, JSValueConst this_val,
                             int argc, JSValueConst *argv, int findIndex)
{
    JSValueConst func, this_arg;
    JSValueConst args[3];
    JSValue obj, val, index_val, res;
    int64_t len, k;

    index_val = JS_UNDEFINED;
    val = JS_UNDEFINED;
    obj = JS_ToObject(ctx, this_val);
    if (js_get_length64(ctx, &len, obj))
        goto exception;

    func = argv[0];
    if (check_function(ctx, func))
        goto exception;

    this_arg = JS_UNDEFINED;
    if (argc > 1)
        this_arg = argv[1];

    for(k = 0; k < len; k++) {
        index_val = JS_NewInt64(ctx, k);
        if (JS_IsException(index_val))
            goto exception;
        val = JS_GetPropertyValue(ctx, obj, index_val);
        if (JS_IsException(val))
            goto exception;
        args[0] = val;
        args[1] = index_val;
        args[2] = this_val;
        res = JS_Call(ctx, func, this_arg, 3, args);
        if (JS_IsException(res))
            goto exception;
        if (JS_ToBoolFree(ctx, res)) {
            if (findIndex) {
                JS_FreeValue(ctx, val);
                JS_FreeValue(ctx, obj);
                return index_val;
            } else {
                JS_FreeValue(ctx, index_val);
                JS_FreeValue(ctx, obj);
                return val;
            }
        }
        JS_FreeValue(ctx, val);
        JS_FreeValue(ctx, index_val);
    }
    JS_FreeValue(ctx, obj);
    if (findIndex)
        return JS_NewInt32(ctx, -1);
    else
        return JS_UNDEFINED;

exception:
    JS_FreeValue(ctx, index_val);
    JS_FreeValue(ctx, val);
    JS_FreeValue(ctx, obj);
    return JS_EXCEPTION;
}